

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_timer.c
# Opt level: O0

void oonf_timer_add(oonf_timer_class *ti)

{
  list_entity **pplVar1;
  oonf_timer_class *ti_local;
  
  (ti->_node).next = &_timer_info_list;
  (ti->_node).prev = _timer_info_list.prev;
  pplVar1 = &(_timer_info_list.prev)->next;
  _timer_info_list.prev = &ti->_node;
  *pplVar1 = &ti->_node;
  return;
}

Assistant:

void
oonf_timer_add(struct oonf_timer_class *ti) {
  list_add_tail(&_timer_info_list, &ti->_node);
}